

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O2

int __thiscall wasm::UnneededSetRemover::remove(UnneededSetRemover *this,char *__filename)

{
  Expression *expression;
  bool bVar1;
  uintptr_t extraout_RAX;
  uintptr_t extraout_RAX_00;
  uintptr_t uVar2;
  Drop *output;
  EffectAnalyzer local_198;
  
  expression = *(Expression **)(__filename + 0x18);
  bVar1 = LocalSet::isTee((LocalSet *)__filename);
  if (bVar1) {
    Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::replaceCurrent
              ((Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_> *)
               this,expression);
    uVar2 = (expression->type).id;
    if (uVar2 != *(uintptr_t *)(__filename + 8)) {
      this->refinalize = true;
    }
  }
  else {
    EffectAnalyzer::EffectAnalyzer
              (&local_198,this->passOptions,this->module,*(Expression **)(__filename + 0x18));
    bVar1 = EffectAnalyzer::hasSideEffects(&local_198);
    EffectAnalyzer::~EffectAnalyzer(&local_198);
    if (bVar1) {
      __filename[0] = '\x12';
      __filename[1] = '\0';
      __filename[2] = '\0';
      __filename[3] = '\0';
      __filename[8] = '\0';
      __filename[9] = '\0';
      __filename[10] = '\0';
      __filename[0xb] = '\0';
      __filename[0xc] = '\0';
      __filename[0xd] = '\0';
      __filename[0xe] = '\0';
      __filename[0xf] = '\0';
      *(Expression **)(__filename + 0x10) = expression;
      Drop::finalize((Drop *)__filename);
      uVar2 = extraout_RAX_00;
    }
    else {
      __filename[0] = '\x16';
      __filename[1] = '\0';
      __filename[2] = '\0';
      __filename[3] = '\0';
      __filename[8] = '\0';
      __filename[9] = '\0';
      __filename[10] = '\0';
      __filename[0xb] = '\0';
      __filename[0xc] = '\0';
      __filename[0xd] = '\0';
      __filename[0xe] = '\0';
      __filename[0xf] = '\0';
      uVar2 = extraout_RAX;
    }
  }
  this->removed = true;
  return (int)uVar2;
}

Assistant:

void remove(LocalSet* set) {
    auto* value = set->value;
    if (set->isTee()) {
      replaceCurrent(value);
      if (value->type != set->type) {
        // The value is more refined, so we'll need to refinalize.
        refinalize = true;
      }
    } else if (EffectAnalyzer(passOptions, module, set->value)
                 .hasSideEffects()) {
      Drop* drop = ExpressionManipulator::convert<LocalSet, Drop>(set);
      drop->value = value;
      drop->finalize();
    } else {
      ExpressionManipulator::nop(set);
    }
    removed = true;
  }